

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

void __thiscall GYMPlayer::~GYMPlayer(GYMPlayer *this)

{
  GYMPlayer *this_local;
  
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__GYMPlayer_001eadf8;
  (this->super_PlayerBase)._eventCbFunc = (PLAYER_EVENT_CB)0x0;
  if ((this->_playState & 1) != 0) {
    (*(this->super_PlayerBase)._vptr_PlayerBase[0x20])();
  }
  (*(this->super_PlayerBase)._vptr_PlayerBase[6])();
  if (this->_cpc1252 != (CPCONV *)0x0) {
    CPConv_Deinit(this->_cpc1252);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_devNames);
  std::vector<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::~vector
            (&this->_devices);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_pcmBuffer);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&this->_tagList);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->_tagData);
  std::vector<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>::~vector(&this->_devCfgs);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_decFData);
  PlayerBase::~PlayerBase(&this->super_PlayerBase);
  return;
}

Assistant:

GYMPlayer::~GYMPlayer()
{
	_eventCbFunc = NULL;	// prevent any callbacks during destruction
	
	if (_playState & PLAYSTATE_PLAY)
		Stop();
	UnloadFile();
	
	if (_cpc1252 != NULL)
		CPConv_Deinit(_cpc1252);
}